

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O3

idx_t duckdb::ExpressionHeuristics::ExpressionCost(BoundCastExpression *expr)

{
  LogicalType *this;
  bool bVar1;
  pointer pEVar2;
  type expr_00;
  idx_t iVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  long lVar4;
  LogicalType local_50;
  LogicalType local_38;
  
  this = &(expr->super_Expression).return_type;
  this_00 = &expr->child;
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&local_50,&pEVar2->return_type);
  bVar1 = LogicalType::operator==(this,&local_50);
  LogicalType::~LogicalType(&local_50);
  if (bVar1) {
    lVar4 = 0;
  }
  else {
    if (this->id_ != VARCHAR) {
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      LogicalType::LogicalType(&local_50,&pEVar2->return_type);
      if ((local_50.id_ == VARCHAR) || (this->id_ == BLOB)) {
        LogicalType::~LogicalType(&local_50);
      }
      else {
        pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        LogicalType::LogicalType(&local_38,&pEVar2->return_type);
        LogicalType::~LogicalType(&local_38);
        LogicalType::~LogicalType(&local_50);
        lVar4 = 5;
        if (local_38.id_ != BLOB) goto LAB_00689c9c;
      }
    }
    lVar4 = 200;
  }
LAB_00689c9c:
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (this_00);
  iVar3 = Cost(expr_00);
  return iVar3 + lVar4;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundCastExpression &expr) {
	// OPERATOR_CAST
	// determine cast cost by comparing cast_expr.source_type and cast_expr_target_type
	idx_t cast_cost = 0;
	if (expr.return_type != expr.source_type()) {
		// if cast from or to varchar
		// TODO: we might want to add more cases
		if (expr.return_type.id() == LogicalTypeId::VARCHAR || expr.source_type().id() == LogicalTypeId::VARCHAR ||
		    expr.return_type.id() == LogicalTypeId::BLOB || expr.source_type().id() == LogicalTypeId::BLOB) {
			cast_cost = 200;
		} else {
			cast_cost = 5;
		}
	}
	return Cost(*expr.child) + cast_cost;
}